

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uchar *input,uchar *output)

{
  int iVar1;
  undefined1 local_90 [8];
  mbedtls_mpi T2;
  mbedtls_mpi T1;
  mbedtls_mpi T;
  size_t olen;
  int ret;
  uchar *output_local;
  uchar *input_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&T1.p);
  mbedtls_mpi_init((mbedtls_mpi *)&T2.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_90);
  olen._4_4_ = mbedtls_mpi_read_binary((mbedtls_mpi *)&T1.p,input,ctx->len);
  if (olen._4_4_ == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&T1.p,&ctx->N);
    if (iVar1 < 0) {
      if (((((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
            (((olen._4_4_ = rsa_prepare_blinding(ctx,f_rng,p_rng), olen._4_4_ == 0 &&
              (olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T1.p,(mbedtls_mpi *)&T1.p,&ctx->Vi),
              olen._4_4_ == 0)) &&
             (olen._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&T1.p,(mbedtls_mpi *)&T1.p,&ctx->N),
             olen._4_4_ == 0)))) &&
           (((olen._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T1.p,&ctx->DP,
                                               &ctx->P,&ctx->RP), olen._4_4_ == 0 &&
             (olen._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)local_90,(mbedtls_mpi *)&T1.p,&ctx->DQ
                                               ,&ctx->Q,&ctx->RQ), olen._4_4_ == 0)) &&
            (olen._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&T1.p,(mbedtls_mpi *)&T2.p,
                                              (mbedtls_mpi *)local_90), olen._4_4_ == 0)))) &&
          ((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T1.p,&ctx->QP),
           olen._4_4_ == 0 &&
           (olen._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&T1.p,(mbedtls_mpi *)&T2.p,&ctx->P),
           olen._4_4_ == 0)))) &&
         (((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T1.p,&ctx->Q),
           olen._4_4_ == 0 &&
           (olen._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&T1.p,(mbedtls_mpi *)local_90,
                                             (mbedtls_mpi *)&T2.p), olen._4_4_ == 0)) &&
          ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
           ((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T1.p,(mbedtls_mpi *)&T1.p,&ctx->Vf),
            olen._4_4_ == 0 &&
            (olen._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&T1.p,(mbedtls_mpi *)&T1.p,&ctx->N),
            olen._4_4_ == 0)))))))) {
        olen._4_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)&T1.p,output,ctx->len);
      }
    }
    else {
      olen._4_4_ = -4;
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)&T1.p);
  mbedtls_mpi_free((mbedtls_mpi *)&T2.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_90);
  if (olen._4_4_ == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = olen._4_4_ + -0x4300;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_private( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 const unsigned char *input,
                 unsigned char *output )
{
    int ret;
    size_t olen;
    mbedtls_mpi T, T1, T2;

    mbedtls_mpi_init( &T ); mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &T, input, ctx->len ) );
    if( mbedtls_mpi_cmp_mpi( &T, &ctx->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( f_rng != NULL )
    {
        /*
         * Blinding
         * T = T * Vi mod N
         */
        MBEDTLS_MPI_CHK( rsa_prepare_blinding( ctx, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );
    }

#if defined(MBEDTLS_RSA_NO_CRT)
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T, &T, &ctx->D, &ctx->N, &ctx->RN ) );
#else
    /*
     * faster decryption using the CRT
     *
     * T1 = input ^ dP mod P
     * T2 = input ^ dQ mod Q
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T1, &T, &ctx->DP, &ctx->P, &ctx->RP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T2, &T, &ctx->DQ, &ctx->Q, &ctx->RQ ) );

    /*
     * T = (T1 - T2) * (Q^-1 mod P) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T, &T1, &T2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1, &T, &ctx->QP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T1, &ctx->P ) );

    /*
     * T = T2 + T * Q
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1, &T, &ctx->Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &T, &T2, &T1 ) );
#endif /* MBEDTLS_RSA_NO_CRT */

    if( f_rng != NULL )
    {
        /*
         * Unblind
         * T = T * Vf mod N
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &T, output, olen ) );

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    mbedtls_mpi_free( &T ); mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_PRIVATE_FAILED + ret );

    return( 0 );
}